

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutokeyCipher.cpp
# Opt level: O1

int __thiscall
AutokeyCipher::decrypt
          (AutokeyCipher *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,*(long *)out,*(long *)(out + 8) + *(long *)out);
  uVar1 = *(undefined8 *)(out + 8);
  if (0 < (int)(uint)uVar1) {
    uVar2 = 0;
    do {
      iVar3 = ((int)*(char *)(*(long *)out + uVar2) - (int)*(char *)(*(long *)ctx + uVar2)) + 0x1a;
      (this->key)._M_dataplus._M_p[uVar2] = (char)iVar3 + (char)(iVar3 / 0x1a) * -0x1a + 'a';
      uVar2 = uVar2 + 1;
    } while (((uint)uVar1 & 0x7fffffff) != uVar2);
  }
  return (int)this;
}

Assistant:

string AutokeyCipher::decrypt(const string& str) { // Decrypt a string
    string decrypted = str;

    // Subtract key from msg (cyclic)
    int str_len = str.length();
    for(int i=0; i<str_len; ++i){
        decrypted[i] = FIRST_LETTER + (str[i] - key[i] + TOTAL_LETTERS)%TOTAL_LETTERS;
    }

    return decrypted;
}